

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O1

commitments_t * allocateCommitments(picnic_instance_t *params,size_t numCommitments)

{
  byte bVar1;
  commitments_t *pcVar2;
  uint8_t **ppuVar3;
  ulong uVar4;
  uint8_t **ppuVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)params->num_rounds;
  pcVar2 = (commitments_t *)malloc((ulong)params->num_rounds << 4);
  if (numCommitments == 0) {
    numCommitments = (size_t)params->num_MPC_parties;
  }
  pcVar2->nCommitments = numCommitments;
  bVar1 = params->digest_size;
  ppuVar3 = (uint8_t **)malloc(numCommitments * uVar8 * ((ulong)bVar1 + 8));
  if (uVar8 != 0) {
    uVar4 = 0;
    do {
      ppuVar5 = ppuVar3 + numCommitments;
      pcVar2[uVar4].hashes = ppuVar3;
      if (numCommitments != 0) {
        uVar6 = 1;
        do {
          *ppuVar3 = (uint8_t *)ppuVar5;
          ppuVar5 = (uint8_t **)((long)ppuVar5 + (ulong)bVar1);
          uVar7 = (ulong)uVar6;
          ppuVar3 = ppuVar3 + 1;
          uVar6 = uVar6 + 1;
        } while (uVar7 < numCommitments);
      }
      ppuVar3 = ppuVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar8);
  }
  return pcVar2;
}

Assistant:

commitments_t* allocateCommitments(const picnic_instance_t* params, size_t numCommitments) {
  commitments_t* commitments = malloc(params->num_rounds * sizeof(commitments_t));

  commitments->nCommitments = numCommitments ? numCommitments : params->num_MPC_parties;

  uint8_t* slab = malloc(params->num_rounds * (commitments->nCommitments * params->digest_size +
                                               commitments->nCommitments * sizeof(uint8_t*)));

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    commitments[i].hashes = (uint8_t**)slab;
    slab += commitments->nCommitments * sizeof(uint8_t*);

    for (uint32_t j = 0; j < commitments->nCommitments; j++) {
      commitments[i].hashes[j] = slab;
      slab += params->digest_size;
    }
  }

  return commitments;
}